

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int verify_sign(void *verify_ctx,uint16_t algo,ptls_iovec_t data,ptls_iovec_t signature)

{
  EVP_PKEY_CTX *pEVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  st_ptls_openssl_signature_scheme_t *psVar5;
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  EVP_MD *pEVar6;
  uint8_t *puVar7;
  size_t sVar8;
  _func_EVP_MD_ptr **pp_Var9;
  EVP_PKEY_CTX *pkey_ctx;
  EVP_PKEY_CTX *local_50;
  size_t local_48;
  uint8_t *local_40;
  EVP_MD_CTX *local_38;
  
  puVar7 = data.base;
  sVar8 = signature.len;
  local_50 = (EVP_PKEY_CTX *)0x0;
  if (puVar7 == (uint8_t *)0x0) {
    iVar3 = 0;
  }
  else {
    local_40 = signature.base;
    psVar5 = lookup_signature_schemes((EVP_PKEY *)verify_ctx);
    if (psVar5 == (st_ptls_openssl_signature_scheme_t *)0x0) {
      iVar3 = 0x203;
    }
    else {
      uVar2 = psVar5->scheme_id;
      iVar3 = 0x2f;
      local_48 = sVar8;
      if (uVar2 != 0xffff) {
        pp_Var9 = &psVar5->scheme_md;
        do {
          if (uVar2 == algo) {
            ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
            if (ctx == (EVP_MD_CTX *)0x0) {
              iVar3 = 0x201;
            }
            else {
              iVar3 = EVP_PKEY_get_id(verify_ctx);
              if (iVar3 == 0x43f) {
                iVar4 = EVP_DigestVerifyInit
                                  (ctx,&local_50,(EVP_MD *)0x0,(ENGINE *)0x0,(EVP_PKEY *)verify_ctx)
                ;
                iVar3 = 0x203;
                if (iVar4 == 1) {
                  iVar4 = EVP_DigestVerify(ctx,local_40,local_48,puVar7,data.len);
LAB_00107533:
                  if (iVar4 == 1) {
                    iVar3 = 0;
                  }
                }
              }
              else {
                type = (EVP_MD *)(**pp_Var9)();
                iVar4 = EVP_DigestVerifyInit
                                  (ctx,&local_50,type,(ENGINE *)0x0,(EVP_PKEY *)verify_ctx);
                iVar3 = 0x203;
                if (iVar4 == 1) {
                  iVar4 = EVP_PKEY_get_id(verify_ctx);
                  if (iVar4 == 6) {
                    iVar4 = EVP_PKEY_CTX_set_rsa_padding(local_50,6);
                    if ((iVar4 == 1) &&
                       (iVar4 = EVP_PKEY_CTX_set_rsa_pss_saltlen(local_50,0xffffffff),
                       pEVar1 = local_50, iVar4 == 1)) {
                      local_38 = ctx;
                      pEVar6 = (**pp_Var9)();
                      ctx = local_38;
                      iVar4 = EVP_PKEY_CTX_set_rsa_mgf1_md(pEVar1,pEVar6);
                      if (iVar4 == 1) goto LAB_00107509;
                    }
                  }
                  else {
LAB_00107509:
                    iVar4 = EVP_DigestVerifyUpdate(ctx,puVar7,data.len);
                    if (iVar4 == 1) {
                      iVar4 = EVP_DigestVerifyFinal(ctx,local_40,local_48);
                      iVar3 = 0x33;
                      goto LAB_00107533;
                    }
                  }
                }
              }
              EVP_MD_CTX_free(ctx);
            }
            break;
          }
          uVar2 = *(uint16_t *)(pp_Var9 + 1);
          pp_Var9 = pp_Var9 + 2;
        } while (uVar2 != 0xffff);
      }
    }
  }
  EVP_PKEY_free((EVP_PKEY *)verify_ctx);
  return iVar3;
}

Assistant:

static int verify_sign(void *verify_ctx, uint16_t algo, ptls_iovec_t data, ptls_iovec_t signature)
{
    EVP_PKEY *key = verify_ctx;
    const struct st_ptls_openssl_signature_scheme_t *scheme;
    EVP_MD_CTX *ctx = NULL;
    EVP_PKEY_CTX *pkey_ctx = NULL;
    int ret = 0;

    if (data.base == NULL)
        goto Exit;

    if ((scheme = lookup_signature_schemes(key)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    for (; scheme->scheme_id != UINT16_MAX; ++scheme)
        if (scheme->scheme_id == algo)
            goto SchemeFound;
    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
    goto Exit;

SchemeFound:
    if ((ctx = EVP_MD_CTX_create()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

#if PTLS_OPENSSL_HAVE_ED25519
    if (EVP_PKEY_id(key) == EVP_PKEY_ED25519) {
        /* ED25519 requires the use of the all-at-once function that appeared in OpenSSL 1.1.1, hence different path */
        if (EVP_DigestVerifyInit(ctx, &pkey_ctx, NULL, NULL, key) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_DigestVerify(ctx, signature.base, signature.len, data.base, data.len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
    } else
#endif
    {
        if (EVP_DigestVerifyInit(ctx, &pkey_ctx, scheme->scheme_md(), NULL, key) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }

        if (EVP_PKEY_id(key) == EVP_PKEY_RSA) {
            if (EVP_PKEY_CTX_set_rsa_padding(pkey_ctx, RSA_PKCS1_PSS_PADDING) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
            if (EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx, -1) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
            if (EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx, scheme->scheme_md()) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
        }
        if (EVP_DigestVerifyUpdate(ctx, data.base, data.len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_DigestVerifyFinal(ctx, signature.base, signature.len) != 1) {
            ret = PTLS_ALERT_DECRYPT_ERROR;
            goto Exit;
        }
    }

    ret = 0;

Exit:
    if (ctx != NULL)
        EVP_MD_CTX_destroy(ctx);
    EVP_PKEY_free(key);
    return ret;
}